

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<int,_pstd::pmr::polymorphic_allocator<int>_>::reserve
          (vector<int,_pstd::pmr::polymorphic_allocator<int>_> *this,size_t n)

{
  int *piVar1;
  iterator piVar2;
  ulong in_RSI;
  vector<int,_pstd::pmr::polymorphic_allocator<int>_> *in_RDI;
  int i;
  int *ra;
  int *in_stack_ffffffffffffffc8;
  polymorphic_allocator<int> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    piVar1 = pmr::polymorphic_allocator<int>::allocate_object<int>
                       (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = (polymorphic_allocator<int> *)(piVar1 + local_1c);
      piVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<int>::construct<int,int>
                (&in_RDI->alloc,(int *)in_stack_ffffffffffffffd0,piVar2 + local_1c);
      piVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<int>::destroy<int>(&in_RDI->alloc,piVar2 + local_1c);
    }
    pmr::polymorphic_allocator<int>::deallocate_object<int>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x4e66a4);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = piVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }